

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O1

string * __thiscall
duckdb::Exception::
ConstructMessageRecursive<duckdb::hugeint_t,duckdb::uhugeint_t,duckdb::uhugeint_t>
          (string *__return_storage_ptr__,Exception *this,string *msg,
          vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>
          *values,hugeint_t param,uhugeint_t params,uhugeint_t params_1)

{
  uint64_t uVar1;
  hugeint_t value;
  uhugeint_t param_00;
  ExceptionFormatValue local_60;
  
  uVar1 = param.upper;
  value.upper = (int64_t)values;
  value.lower = param.lower;
  ExceptionFormatValue::CreateFormatValue<duckdb::hugeint_t>
            (&local_60,(ExceptionFormatValue *)values,value);
  ::std::vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_>::
  emplace_back<duckdb::ExceptionFormatValue>
            ((vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_> *)
             msg,&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60.str_val._M_dataplus._M_p != &local_60.str_val.field_2) {
    operator_delete(local_60.str_val._M_dataplus._M_p);
  }
  param_00.upper = uVar1;
  param_00.lower = params.upper;
  ConstructMessageRecursive<duckdb::uhugeint_t,duckdb::uhugeint_t>
            (__return_storage_ptr__,this,msg,
             (vector<duckdb::ExceptionFormatValue,_std::allocator<duckdb::ExceptionFormatValue>_> *)
             params.lower,param_00,params_1);
  return __return_storage_ptr__;
}

Assistant:

static string ConstructMessageRecursive(const string &msg, std::vector<ExceptionFormatValue> &values, T param,
	                                        ARGS... params) {
		values.push_back(ExceptionFormatValue::CreateFormatValue<T>(param));
		return ConstructMessageRecursive(msg, values, params...);
	}